

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

bool __thiscall args::Group::Matched(Group *this)

{
  undefined8 uVar1;
  bool bVar2;
  
  if ((this->validator).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar2 = (*(this->validator)._M_invoker)((_Any_data *)&this->validator,this);
    return bVar2;
  }
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

virtual bool Matched() const noexcept override
            {
                return validator(*this);
            }